

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O1

int Ssw_RarManCheckNonConstOutputs(Ssw_RarMan_t *p,int iFrame,abctime Time)

{
  int *piVar1;
  Aig_Obj_t *pObj;
  _func_int_int_Abc_Cex_t_ptr *p_Var2;
  bool bVar3;
  int iVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  Aig_Man_t *pAVar10;
  uint level;
  long lVar11;
  
  p->iFailPo = -1;
  p->iFailPat = -1;
  pAVar10 = p->pAig;
  uVar7 = (ulong)(uint)pAVar10->nTruePos;
  if (0 < pAVar10->nTruePos) {
    lVar11 = 0;
    do {
      if (pAVar10->vCos->nSize <= lVar11) goto LAB_006aafff;
      pObj = (Aig_Obj_t *)pAVar10->vCos->pArray[lVar11];
      if ((pAVar10->nConstrs != 0) && ((int)uVar7 - pAVar10->nConstrs <= lVar11)) break;
      pVVar5 = p->vCexes;
      if (pVVar5 == (Vec_Ptr_t *)0x0) {
LAB_006aae6c:
        iVar4 = Ssw_RarManPoIsConst0(p,pObj);
        if (iVar4 == 0) {
          p->iFailPo = (int)lVar11;
          iVar4 = Ssw_RarManObjWhichOne(p,pObj);
          p->iFailPat = iVar4;
          if (p->pPars->fSolveAll == 0) break;
          piVar1 = &p->pPars->nSolved;
          *piVar1 = *piVar1 + 1;
          if (p->vCexes == (Vec_Ptr_t *)0x0) {
            iVar4 = p->pAig->nTruePos;
            pVVar5 = (Vec_Ptr_t *)malloc(0x10);
            iVar8 = iVar4;
            if (iVar4 - 1U < 7) {
              iVar8 = 8;
            }
            pVVar5->nSize = 0;
            pVVar5->nCap = iVar8;
            if (iVar8 == 0) {
              ppvVar6 = (void **)0x0;
            }
            else {
              ppvVar6 = (void **)malloc((long)iVar8 << 3);
            }
            pVVar5->pArray = ppvVar6;
            pVVar5->nSize = iVar4;
            memset(ppvVar6,0,(long)iVar4 << 3);
            p->vCexes = pVVar5;
          }
          if (p->vCexes->nSize <= lVar11) {
LAB_006aafff:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          ppvVar6 = p->vCexes->pArray;
          if (ppvVar6[lVar11] != (void *)0x0) {
            __assert_fail("Vec_PtrEntry(p->vCexes, i) == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswRarity.c"
                          ,0x26b,"int Ssw_RarManCheckNonConstOutputs(Ssw_RarMan_t *, int, abctime)")
            ;
          }
          ppvVar6[lVar11] = (void *)0x1;
          p_Var2 = p->pPars->pFuncOnFail;
          if ((p_Var2 != (_func_int_int_Abc_Cex_t_ptr *)0x0) &&
             (iVar4 = (*p_Var2)((int)lVar11,(Abc_Cex_t *)0x0), iVar4 != 0)) {
            return 2;
          }
          if (p->pPars->fNotVerbose == 0) {
            level = p->pAig->nTruePos;
            uVar7 = (ulong)level;
            if (1 < level) {
              uVar7 = 0;
              uVar9 = level - 1;
              if (level - 1 != 0) {
                do {
                  uVar7 = (ulong)((int)uVar7 + 1);
                  bVar3 = 9 < uVar9;
                  uVar9 = uVar9 / 10;
                } while (bVar3);
              }
            }
            Abc_Print(level,
                      "Output %*d was asserted in frame %4d (solved %*d out of %*d outputs).  ",
                      uVar7,(ulong)(uint)p->iFailPo,iFrame,uVar7,(ulong)(uint)p->pPars->nSolved,
                      uVar7,(ulong)level);
            Abc_Print(level,"%s =","Time");
            Abc_Print(level,"%9.2f sec\n",(double)Time / 1000000.0);
          }
        }
      }
      else {
        if (pVVar5->nSize <= lVar11) goto LAB_006aafff;
        if (pVVar5->pArray[lVar11] == (void *)0x0) goto LAB_006aae6c;
      }
      lVar11 = lVar11 + 1;
      pAVar10 = p->pAig;
      uVar7 = (ulong)pAVar10->nTruePos;
    } while (lVar11 < (long)uVar7);
  }
  return (uint)~p->iFailPo >> 0x1f;
}

Assistant:

int Ssw_RarManCheckNonConstOutputs( Ssw_RarMan_t * p, int iFrame, abctime Time )
{
    Aig_Obj_t * pObj;
    int i;
    p->iFailPo  = -1;
    p->iFailPat = -1;
    Saig_ManForEachPo( p->pAig, pObj, i )
    {
        if ( p->pAig->nConstrs && i >= Saig_ManPoNum(p->pAig) - p->pAig->nConstrs )
            break;
        if ( p->vCexes && Vec_PtrEntry(p->vCexes, i) )
            continue;
        if ( Ssw_RarManPoIsConst0(p, pObj) )
            continue;
        p->iFailPo  = i;
        p->iFailPat = Ssw_RarManObjWhichOne( p, pObj );
        if ( !p->pPars->fSolveAll )
            break;
        // remember the one solved
        p->pPars->nSolved++;
        if ( p->vCexes == NULL )
            p->vCexes = Vec_PtrStart( Saig_ManPoNum(p->pAig) );
        assert( Vec_PtrEntry(p->vCexes, i) == NULL );
        Vec_PtrWriteEntry( p->vCexes, i, (void *)(ABC_PTRINT_T)1 );
        if ( p->pPars->pFuncOnFail && p->pPars->pFuncOnFail(i, NULL) )
            return 2; // quitting due to callback
        // print final report
        if ( !p->pPars->fNotVerbose )
        {
            int nOutDigits = Abc_Base10Log( Saig_ManPoNum(p->pAig) );
            Abc_Print( 1, "Output %*d was asserted in frame %4d (solved %*d out of %*d outputs).  ", 
                nOutDigits, p->iFailPo, iFrame, 
                nOutDigits, p->pPars->nSolved, 
                nOutDigits, Saig_ManPoNum(p->pAig) );
            Abc_PrintTime( 1, "Time", Time );
        }
    }
    if ( p->iFailPo >= 0 ) // found CEX
        return 1;
    else
        return 0;
}